

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

char * find_build_path(void)

{
  int iVar1;
  char *__dest;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  __dest = (char *)malloc(0x6f);
  memcpy(__dest,
         "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/process.c"
         ,99);
  pcVar3 = __dest + 0x61;
  do {
    if (((pcVar3[-8] == 'i') && (*pcVar3 == 'h')) &&
       (iVar1 = strncmp("ipc-bench",pcVar3 + -8,9), pcVar2 = pcVar3, iVar1 == 0)) break;
    pcVar2 = pcVar3 + -1;
    pcVar4 = pcVar3 + -9;
    pcVar3 = pcVar2;
  } while (__dest <= pcVar4);
  builtin_strncpy(pcVar2 + 1,"/build/source",0xe);
  return __dest;
}

Assistant:

char *find_build_path() {
	char *path = (char *)malloc(strlen(__FILE__) + strlen(BUILD_PATH));
	char *right;
	char *left;

	strcpy(path, __FILE__);
	right = path + strlen(__FILE__);
	left = right - strlen("ipc-bench");

	// Make the string-comparison expected O(N)
	// by only doing a string-comparison when
	// the first and last character match
	for (--right; left >= path; --left, --right) {
		if (*left == 'i' && *right == 'h') {
			if (strncmp("ipc-bench", left, 9) == 0) {
				break;
			}
		}
	}

	// ++ because right is on the 'h'
	strcpy(++right, BUILD_PATH);

	return path;
}